

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int create_course(course *course,course_strings *data)

{
  uchar *puVar1;
  uchar *puVar2;
  byte *pbVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  subject_area sVar7;
  class_type cVar8;
  char *__ptr;
  ushort **ppuVar9;
  long lVar10;
  char *pcVar11;
  ushort *puVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  int val;
  byte local_3a;
  char start_merid;
  char *local_38;
  
  course->course_name = data->course_name;
  course->co_requisites = data->co_requisites;
  course->instructor = data->instructor;
  course->pre_requisites = data->pre_requisites;
  course->course_id = data->course_id;
  iVar6 = parse_int(&val,data->units);
  if (iVar6 == 0) {
    course->units = (uchar)val;
    iVar6 = parse_int(&val,data->max_enroll);
    if (iVar6 == 0) {
      course->max_enrollment = (unsigned_short)val;
      pcVar14 = data->final_exam;
      puVar1 = &(course->final_exam_date).start_hour;
      puVar2 = &(course->final_exam_date).end_hour;
      iVar6 = __isoc99_sscanf(pcVar14,
                              " %2hhu/%2hhu/%4hu %2hhu:%2hhu%1c.M. - %2hhu:%2hhu:%2hhu%1c.M. ",
                              &course->final_exam_date,&(course->final_exam_date).day,
                              &(course->final_exam_date).year,puVar1,
                              &(course->final_exam_date).start_minute,&start_merid,puVar2,
                              &(course->final_exam_date).end_minute,&local_3a);
      if (iVar6 != -1) {
        if ((start_merid & 0xdfU) == 0x50) {
          *puVar1 = *puVar1 + '\f';
        }
        if ((local_3a & 0xdf) == 0x50) {
          *puVar2 = *puVar2 + '\f';
        }
        if (iVar6 != -1) {
          pcVar15 = data->course_id;
          __ptr = (char *)malloc((size_t)pcVar14);
          if (__ptr != (char *)0x0) {
            ppuVar9 = __ctype_b_loc();
            lVar10 = -1;
            do {
              bVar4 = pcVar15[lVar10 + 1];
              uVar13 = (ulong)bVar4;
              lVar10 = lVar10 + 1;
            } while ((*(byte *)((long)*ppuVar9 + (long)(char)bVar4 * 2 + 1) & 0x20) != 0);
            if (bVar4 != 0) {
              puVar12 = *ppuVar9;
              pcVar11 = __ptr;
              if ((puVar12[(char)bVar4] & 8) == 0) {
                pcVar14 = (char *)0x0;
              }
              else {
                do {
                  *pcVar11 = (char)uVar13;
                  uVar13 = (ulong)pcVar15[lVar10 + 1];
                  pcVar14 = (char *)CONCAT71((int7)((ulong)pcVar14 >> 8),uVar13 == 0);
                  if (uVar13 == 0) goto LAB_00105186;
                  puVar12 = *ppuVar9;
                  lVar10 = lVar10 + 1;
                  pcVar11 = pcVar11 + 1;
                } while ((puVar12[uVar13] & 8) != 0);
              }
              if ((char)pcVar14 == '\0') {
                pcVar15 = pcVar15 + lVar10;
                do {
                  cVar5 = *pcVar15;
                  uVar13 = (ulong)cVar5;
                  pcVar15 = pcVar15 + 1;
                } while ((*(byte *)((long)puVar12 + uVar13 * 2 + 1) & 0x20) != 0);
                local_38 = __ptr;
                if ((cVar5 != '\0') &&
                   (pcVar11 = (char *)malloc((size_t)pcVar14), pcVar14 = local_38, __ptr = local_38,
                   pcVar11 != (char *)0x0)) {
                  lVar10 = 0;
                  do {
                    if (((*ppuVar9)[(char)uVar13] & 8) == 0) break;
                    pcVar11[lVar10] = (char)uVar13;
                    pbVar3 = (byte *)(pcVar15 + lVar10);
                    uVar13 = (ulong)*pbVar3;
                    lVar10 = lVar10 + 1;
                  } while (*pbVar3 != 0);
                  sVar7 = parse_subject_area(local_38);
                  course->subject_area = sVar7;
                  course->course_number = pcVar11;
                  free(pcVar14);
                  cVar8 = parse_class_type(data->class_type);
                  course->class_type = cVar8;
                  iVar6 = parse_days(course->days,data->days);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  iVar6 = parse_times(course,data->times);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  iVar6 = parse_int(&val,data->available_seats);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  course->available_seats = (unsigned_short)val;
                  iVar6 = parse_course_status(&course->status,data->course_status);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  iVar6 = parse_int(&val,data->section_number);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  course->section = (unsigned_short)val;
                  iVar6 = parse_int(&val,data->call_number);
                  if (iVar6 != 0) {
                    return -1;
                  }
                  course->call_number = val;
                  return 0;
                }
              }
            }
LAB_00105186:
            free(__ptr);
          }
        }
      }
    }
  }
  return -1;
}

Assistant:

int create_course(struct course *course, const struct course_strings *data)
{
	int val, ret;

	course->course_name = data->course_name;
	course->co_requisites = data->co_requisites;
	course->instructor = data->instructor;
	course->pre_requisites = data->pre_requisites;
	course->course_id = data->course_id;

	ret = parse_int(&val, data->units);
	if (ret) return -1;
	course->units = val;

	ret = parse_int(&val, data->max_enroll);
	if (ret) return -1;
	course->max_enrollment = val;

	ret = parse_final_exam(course, data->final_exam);
	if (ret) return -1;

	ret = parse_course_id(&course->subject_area, &course->course_number, data->course_id);
	if (ret) return -1;

	course->class_type = parse_class_type(data->class_type);

	ret = parse_days(course->days, data->days);
	if (ret) return -1;

	ret = parse_times(course, data->times);
	if (ret) return -1;

	ret = parse_int(&val, data->available_seats);
	if (ret) return -1;
	course->available_seats = val;

	ret = parse_course_status(&course->status, data->course_status);
	if (ret) return -1;

	ret = parse_int(&val, data->section_number);
	if (ret) return -1;
	course->section = val;

	ret = parse_int(&val, data->call_number);
	if (ret) return -1;
	course->call_number = val;

	return 0;
}